

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O0

DdNode * Extra_zddGetSymmetricVars(DdManager *dd,DdNode *bF,DdNode *bG,DdNode *bVars)

{
  DdNode *pDVar1;
  DdNode *res;
  DdNode *bVars_local;
  DdNode *bG_local;
  DdNode *bF_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = extraZddGetSymmetricVars(dd,bF,bG,bVars);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode * Extra_zddGetSymmetricVars( 
  DdManager * dd,    /* the DD manager */
  DdNode * bF,       /* the first function  - originally, the positive cofactor */
  DdNode * bG,       /* the second fucntion - originally, the negative cofactor */
  DdNode * bVars)    /* the set of variables, on which F and G depend */
{
    DdNode * res;
    do {
        dd->reordered = 0;
        res = extraZddGetSymmetricVars( dd, bF, bG, bVars );
    } while (dd->reordered == 1);
    return(res);

}